

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

NamespaceDeclaration * __thiscall
QXmlStreamWriterPrivate::addExtraNamespace
          (QXmlStreamWriterPrivate *this,QAnyStringView namespaceUri,QAnyStringView prefix)

{
  QLatin1StringView str;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  bool bVar1;
  bool bVar2;
  ushort *puVar3;
  NamespaceDeclaration *pNVar4;
  QXmlStreamPrivateTagStack *in_RDI;
  long in_FS_OFFSET;
  QAnyStringView s;
  NamespaceDeclaration *namespaceDeclaration;
  bool namespaceUriIsXml;
  bool prefixIsXml;
  QString prefixString_1;
  QString prefixString;
  QAnyStringView *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  QAnyStringView *in_stack_fffffffffffffe18;
  QMessageLogger *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  qsizetype local_130;
  QString *local_110;
  qsizetype qStack_108;
  qsizetype local_100;
  QString local_d8 [2];
  QMessageLogger local_a8;
  QString local_88;
  QMessageLogger local_68 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffe18,
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  str.m_data = in_stack_fffffffffffffe28;
  str.m_size = (qsizetype)in_stack_fffffffffffffe20;
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffe18,str);
  bVar1 = ::operator==((QAnyStringView *)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       in_stack_fffffffffffffe08);
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffe18,
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  str_00.m_data = in_stack_fffffffffffffe28;
  str_00.m_size = (qsizetype)in_stack_fffffffffffffe20;
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffe18,str_00);
  bVar2 = ::operator==((QAnyStringView *)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       in_stack_fffffffffffffe08);
  if ((!bVar1) || (bVar2)) {
    if ((!bVar1) && (bVar2)) {
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QAnyStringView::toString
                ((QAnyStringView *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe14,(char *)in_stack_fffffffffffffe08);
      QtPrivate::asString(&local_88);
      puVar3 = QString::utf16((QString *)
                              CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      QMessageLogger::warning
                (&local_a8,
                 "The prefix \'%ls\' must not be bound to namespace name \'http://www.w3.org/XML/1998/namespace\' which \'xml\' is already bound to"
                 ,puVar3);
      QString::~QString((QString *)0x64ce60);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe14
               ,(char *)in_stack_fffffffffffffe08);
    QMessageLogger::warning
              (local_68,
               "Reserved prefix \'xml\' must not be bound to a different namespace name than \'http://www.w3.org/XML/1998/namespace\'"
              );
  }
  s = (QAnyStringView)
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffe18,
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  str_01.m_data = in_stack_fffffffffffffe28;
  str_01.m_size = (qsizetype)in_stack_fffffffffffffe20;
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffe18,str_01);
  bVar1 = ::operator==((QAnyStringView *)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       in_stack_fffffffffffffe08);
  if (bVar1) {
    local_d8[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8[0].d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QAnyStringView::toString
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe14
               ,(char *)in_stack_fffffffffffffe08);
    QtPrivate::asString(local_d8);
    puVar3 = QString::utf16((QString *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
                           );
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffff08,
               "The prefix \'%ls\' must not be bound to namespace name \'http://www.w3.org/2000/xmlns/\'"
               ,puVar3);
    QString::~QString((QString *)0x64cf73);
  }
  pNVar4 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
                     ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                      CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  QXmlStreamPrivateTagStack::addToStringStorage(in_RDI,s);
  (pNVar4->prefix).m_size = local_100;
  (pNVar4->prefix).m_string = local_110;
  (pNVar4->prefix).m_pos = qStack_108;
  QXmlStreamPrivateTagStack::addToStringStorage(in_RDI,s);
  (pNVar4->namespaceUri).m_size = local_130;
  *(undefined4 *)&(pNVar4->namespaceUri).m_string = local_140;
  *(undefined4 *)((long)&(pNVar4->namespaceUri).m_string + 4) = uStack_13c;
  *(undefined4 *)&(pNVar4->namespaceUri).m_pos = uStack_138;
  *(undefined4 *)((long)&(pNVar4->namespaceUri).m_pos + 4) = uStack_134;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pNVar4;
}

Assistant:

QXmlStreamPrivateTagStack::NamespaceDeclaration &
QXmlStreamWriterPrivate::addExtraNamespace(QAnyStringView namespaceUri, QAnyStringView prefix)
{
    const bool prefixIsXml = prefix == "xml"_L1;
    const bool namespaceUriIsXml = namespaceUri == "http://www.w3.org/XML/1998/namespace"_L1;
    if (prefixIsXml && !namespaceUriIsXml) {
        qWarning("Reserved prefix 'xml' must not be bound to a different namespace name "
                 "than 'http://www.w3.org/XML/1998/namespace'");
    } else if (!prefixIsXml && namespaceUriIsXml) {
        const QString prefixString = prefix.toString();
        qWarning("The prefix '%ls' must not be bound to namespace name "
                 "'http://www.w3.org/XML/1998/namespace' which 'xml' is already bound to",
                 qUtf16Printable(prefixString));
    }
    if (namespaceUri == "http://www.w3.org/2000/xmlns/"_L1) {
        const QString prefixString = prefix.toString();
        qWarning("The prefix '%ls' must not be bound to namespace name "
                 "'http://www.w3.org/2000/xmlns/'",
                 qUtf16Printable(prefixString));
    }
    auto &namespaceDeclaration = namespaceDeclarations.push();
    namespaceDeclaration.prefix = addToStringStorage(prefix);
    namespaceDeclaration.namespaceUri = addToStringStorage(namespaceUri);
    return namespaceDeclaration;
}